

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol.h
# Opt level: O0

void mp::internal::WriteSuffixes<mp::BasicSuffixSet<std::allocator<char>>>
               (BufferedFile *file,BasicSuffixSet<std::allocator<char>_> *suffixes)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 uVar4;
  SuffixBase args_4;
  SuffixBase this;
  CStringRef arg0;
  SuffixBase args_2;
  SuffixBase *this_00;
  SuffixTable *args_1;
  long lVar5;
  ulong uVar6;
  difference_type dVar7;
  size_t sVar8;
  long in_RSI;
  BufferedFile *in_RDI;
  SuffixValueWriter writer;
  int tabNlines;
  int tablen;
  SuffixTable *table;
  int mask;
  char *name;
  int num_values;
  SuffixValueCounter counter;
  iterator e;
  iterator i;
  BasicSuffixSet<std::allocator<char>_> *in_stack_ffffffffffffff08;
  const_iterator in_stack_ffffffffffffff10;
  BufferedFile *in_stack_ffffffffffffff20;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff28;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff30;
  SuffixBase in_stack_ffffffffffffff38;
  CStringRef in_stack_ffffffffffffff40;
  BasicCStringRef<char> local_b8;
  long local_b0;
  Proxy local_a8;
  uint local_9c;
  BasicCStringRef<char> local_98;
  undefined1 local_89;
  undefined8 local_88;
  undefined8 local_80;
  undefined4 in_stack_ffffffffffffffa0;
  _Base_ptr in_stack_ffffffffffffffc8;
  Proxy local_30;
  _Base_ptr local_28;
  const_iterator local_20;
  const_iterator local_18;
  BufferedFile *local_8;
  
  if (in_RSI != 0) {
    local_8 = in_RDI;
    local_18._M_node =
         (_Base_ptr)BasicSuffixSet<std::allocator<char>_>::begin(in_stack_ffffffffffffff08);
    local_20._M_node =
         (_Base_ptr)BasicSuffixSet<std::allocator<char>_>::end(in_stack_ffffffffffffff08);
    while( true ) {
      local_28 = local_20._M_node;
      bVar1 = BasicSuffixSet<std::allocator<char>_>::iterator::operator!=
                        ((iterator *)in_stack_ffffffffffffff08,
                         (iterator)in_stack_ffffffffffffff10._M_node);
      if (!bVar1) break;
      local_30 = BasicSuffixSet<std::allocator<char>_>::iterator::operator->
                           ((iterator *)in_stack_ffffffffffffff08);
      BasicSuffixSet<std::allocator<char>_>::iterator::Proxy::operator->(&local_30);
      uVar2 = SuffixBase::kind((SuffixBase *)0x22b469);
      if ((uVar2 & 0x10) != 0) {
        SuffixValueCounter::SuffixValueCounter((SuffixValueCounter *)&stack0xffffffffffffffcc);
        args_4.impl_ = (Impl *)BasicSuffixSet<std::allocator<char>_>::iterator::operator->
                                         ((iterator *)in_stack_ffffffffffffff08);
        BasicSuffixSet<std::allocator<char>_>::iterator::Proxy::operator->
                  ((Proxy *)&stack0xffffffffffffffc0);
        Suffix::VisitValues<mp::internal::SuffixValueCounter>
                  ((Suffix *)in_stack_ffffffffffffff30._M_current,
                   (SuffixValueCounter *)in_stack_ffffffffffffff28._M_current);
        SuffixValueCounter::num_values((SuffixValueCounter *)&stack0xffffffffffffffcc);
        this.impl_ = (Impl *)BasicSuffixSet<std::allocator<char>_>::iterator::operator->
                                       ((iterator *)in_stack_ffffffffffffff08);
        BasicSuffixSet<std::allocator<char>_>::iterator::Proxy::operator->
                  ((Proxy *)&stack0xffffffffffffffa8);
        arg0.data_ = SuffixBase::name((SuffixBase *)0x22b4f3);
        uVar2 = 0xf;
        args_2.impl_ = (Impl *)BasicSuffixSet<std::allocator<char>_>::iterator::operator->
                                         ((iterator *)in_stack_ffffffffffffff08);
        this_00 = &BasicSuffixSet<std::allocator<char>_>::iterator::Proxy::operator->
                             ((Proxy *)&stack0xffffffffffffff90)->super_SuffixBase;
        args_1 = SuffixBase::table_abi_cxx11_(this_00);
        lVar5 = std::__cxx11::string::size();
        if (lVar5 == 0) {
          in_stack_ffffffffffffff30._M_current = (char *)0x0;
        }
        else {
          lVar5 = std::__cxx11::string::size();
          in_stack_ffffffffffffff30._M_current = (char *)(lVar5 + 1);
        }
        iVar3 = (int)in_stack_ffffffffffffff30._M_current;
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          local_80 = std::__cxx11::string::begin();
          local_88 = std::__cxx11::string::end();
          local_89 = 10;
          dVar7 = std::count<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                             (char *)in_stack_ffffffffffffff20);
          in_stack_ffffffffffffff28._M_current = (char *)(dVar7 + 1);
        }
        else {
          in_stack_ffffffffffffff28._M_current = (char *)0x0;
        }
        uVar4 = SUB84(in_stack_ffffffffffffff28._M_current,0);
        in_stack_ffffffffffffff20 = local_8;
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_98,"suffix {} {} {} {} {}\n{}\n");
        local_a8 = BasicSuffixSet<std::allocator<char>_>::iterator::operator->
                             ((iterator *)in_stack_ffffffffffffff08);
        BasicSuffixSet<std::allocator<char>_>::iterator::Proxy::operator->(&local_a8);
        local_9c = SuffixBase::kind((SuffixBase *)0x22b628);
        local_9c = local_9c & uVar2;
        sVar8 = strlen(arg0.data_);
        local_b0 = sVar8 + 1;
        in_stack_ffffffffffffff08 =
             (BasicSuffixSet<std::allocator<char>_> *)&stack0xffffffffffffff88;
        in_stack_ffffffffffffff10._M_node = (_Base_ptr)&stack0xffffffffffffffb0;
        fmt::BufferedFile::print<int,int,unsigned_long,int,int,char_const*>
                  ((BufferedFile *)this.impl_,arg0,(int *)CONCAT44(uVar2,in_stack_ffffffffffffffa0),
                   (int *)args_1,(unsigned_long *)args_2.impl_,(int *)CONCAT44(iVar3,uVar4),
                   (int *)args_4.impl_,(char **)in_stack_ffffffffffffffc8);
        if (iVar3 != 0) {
          fmt::BasicCStringRef<char>::BasicCStringRef(&local_b8,"{}\n");
          fmt::BufferedFile::print<std::__cxx11::string>
                    ((BufferedFile *)in_stack_ffffffffffffff38.impl_,in_stack_ffffffffffffff40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff30._M_current);
        }
        SuffixValueWriter::SuffixValueWriter((SuffixValueWriter *)&stack0xffffffffffffff40,local_8);
        in_stack_ffffffffffffff38.impl_ =
             (Impl *)BasicSuffixSet<std::allocator<char>_>::iterator::operator->
                               ((iterator *)in_stack_ffffffffffffff08);
        BasicSuffixSet<std::allocator<char>_>::iterator::Proxy::operator->
                  ((Proxy *)&stack0xffffffffffffff38);
        Suffix::VisitValues<mp::internal::SuffixValueWriter>
                  ((Suffix *)in_stack_ffffffffffffff30._M_current,
                   (SuffixValueWriter *)in_stack_ffffffffffffff28._M_current);
      }
      BasicSuffixSet<std::allocator<char>_>::iterator::operator++
                ((iterator *)in_stack_ffffffffffffff10._M_node);
    }
  }
  return;
}

Assistant:

void WriteSuffixes(fmt::BufferedFile &file, const SuffixMap *suffixes) {
  if (!suffixes)
    return;
  for (typename SuffixMap::iterator
       i = suffixes->begin(), e = suffixes->end(); i != e; ++i) {
    if ((i->kind() & suf::OUTPUT) == 0)
      continue;
    SuffixValueCounter counter;
    i->VisitValues(counter);
    int num_values = counter.num_values();
    const char *name = i->name();
    int mask = internal::SUFFIX_KIND_MASK | suf::FLOAT | suf::IODECL;
    const auto& table = i->table();
    int tablen = table.size() ? table.size()+1 : 0;
    int tabNlines = table.empty()? 0 :
                                   1+std::count(table.begin(), table.end(), '\n');
    file.print("suffix {} {} {} {} {}\n{}\n",
               i->kind() & mask, num_values, std::strlen(name) + 1,
               tablen, tabNlines, name);
    if (tablen)
      file.print("{}\n", table);
    SuffixValueWriter writer(file);
    i->VisitValues(writer);
  }
}